

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

int __thiscall amrex::ParmParse::remove(ParmParse *this,char *__filename)

{
  bool bVar1;
  iterator it;
  int r;
  PP_entry *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff57;
  const_iterator __position;
  _List_const_iterator<amrex::ParmParse::PP_entry> local_90;
  _List_node_base *local_88;
  allocator local_69;
  string *in_stack_ffffffffffffff98;
  ParmParse *in_stack_ffffffffffffffa0;
  string local_48 [32];
  _Self local_28;
  _Self local_20;
  int local_14;
  _List_node_base *local_10;
  ParmParse *local_8;
  
  local_14 = 0;
  local_10 = (_List_node_base *)__filename;
  local_8 = this;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
       begin((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
             in_stack_ffffffffffffff48);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
         ::end((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
               in_stack_ffffffffffffff48);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    __position._M_node = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff98,(char *)__position._M_node,&local_69);
    prefixedName(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::_List_iterator<amrex::ParmParse::PP_entry>::operator*
              ((_List_iterator<amrex::ParmParse::PP_entry> *)0xf14809);
    in_stack_ffffffffffffff57 =
         anon_unknown_12::ppfound
                   ((string *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff48,false);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if ((in_stack_ffffffffffffff57 & 1) == 0) {
      std::_List_iterator<amrex::ParmParse::PP_entry>::operator++(&local_20);
    }
    else {
      in_stack_ffffffffffffff48 = (PP_entry *)this->m_table;
      std::_List_const_iterator<amrex::ParmParse::PP_entry>::_List_const_iterator
                (&local_90,&local_20);
      local_88 = (_List_node_base *)
                 std::__cxx11::
                 list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
                 erase((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),__position);
      local_14 = local_14 + 1;
      local_20._M_node = local_88;
    }
  }
  return local_14;
}

Assistant:

int
ParmParse::remove (const char* name)
{
    int r = 0;
    for (auto it = m_table.begin(); it != m_table.end(); ) {
        if (ppfound(prefixedName(name), *it, false)) {
            it = m_table.erase(it);
            ++r;
        } else {
            ++it;
        }
    }
    return r;
}